

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfilt.c
# Opt level: O1

void lograw(uchar *buffer,ssize_t len)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  char *format;
  long lVar5;
  long lVar6;
  int iVar7;
  char *buffer_00;
  char data [120];
  char local_a8 [120];
  
  if (0 < len) {
    buffer_00 = local_a8;
    iVar7 = 0x78;
    lVar5 = 0;
    lVar6 = 0;
    do {
      bVar1 = buffer[lVar6];
      if (bVar1 == 0xd) {
        format = "\\r";
LAB_00106569:
        curl_msnprintf(buffer_00,(long)iVar7,format);
        iVar2 = -2;
        lVar3 = 2;
      }
      else {
        if (bVar1 == 10) {
          format = "\\n";
          goto LAB_00106569;
        }
        iVar2 = Curl_isgraph((uint)bVar1);
        if ((iVar2 != 0) || (uVar4 = 0x2e, buffer[lVar6] == ' ')) {
          uVar4 = (ulong)buffer[lVar6];
        }
        curl_msnprintf(buffer_00,(long)iVar7,"%c",uVar4);
        iVar2 = -1;
        lVar3 = 1;
      }
      lVar5 = lVar5 + lVar3;
      if (lVar5 < 0x3d) {
        buffer_00 = buffer_00 + lVar3;
        iVar7 = iVar7 + iVar2;
      }
      else {
        buffer_00 = local_a8;
        logmsg("\'%s\'",buffer_00);
        iVar7 = 0x78;
        lVar5 = 0;
      }
      lVar6 = lVar6 + 1;
    } while (len != lVar6);
    if (lVar5 != 0) {
      logmsg("\'%s\'",local_a8);
    }
  }
  return;
}

Assistant:

static void lograw(unsigned char *buffer, ssize_t len)
{
  char data[120];
  ssize_t i;
  unsigned char *ptr = buffer;
  char *optr = data;
  ssize_t width = 0;
  int left = sizeof(data);

  for(i = 0; i<len; i++) {
    switch(ptr[i]) {
    case '\n':
      snprintf(optr, left, "\\n");
      width += 2;
      optr += 2;
      left -= 2;
      break;
    case '\r':
      snprintf(optr, left, "\\r");
      width += 2;
      optr += 2;
      left -= 2;
      break;
    default:
      snprintf(optr, left, "%c", (ISGRAPH(ptr[i]) ||
                                  ptr[i] == 0x20) ?ptr[i]:'.');
      width++;
      optr++;
      left--;
      break;
    }

    if(width>60) {
      logmsg("'%s'", data);
      width = 0;
      optr = data;
      left = sizeof(data);
    }
  }
  if(width)
    logmsg("'%s'", data);
}